

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
::write_double<long_double>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
           *this,longdouble value,format_specs *spec)

{
  bool bVar1;
  alignment aVar2;
  type pwVar3;
  align_spec *in_RSI;
  longdouble in_stack_00000008;
  type *it;
  align_spec as;
  size_t n;
  format_specs normalized_spec;
  bool use_grisu;
  memory_buffer buffer;
  write_inf_or_nan_t write_inf_or_nan;
  char sign;
  float_spec_handler handler;
  float_spec_handler *in_stack_fffffffffffffcd8;
  allocator<char> *alloc;
  size_t n_00;
  undefined2 uVar4;
  undefined5 in_stack_fffffffffffffce2;
  char in_stack_fffffffffffffce7;
  char *in_stack_fffffffffffffce8;
  write_inf_or_nan_t *in_stack_fffffffffffffcf0;
  undefined2 in_stack_fffffffffffffcf8;
  char local_2f1;
  undefined1 in_stack_fffffffffffffd28;
  undefined7 in_stack_fffffffffffffd29;
  undefined8 in_stack_fffffffffffffd30;
  undefined2 in_stack_fffffffffffffd38;
  undefined6 in_stack_fffffffffffffd3a;
  align_spec *spec_00;
  core_format_specs in_stack_fffffffffffffd40;
  allocator<char> local_261;
  basic_buffer<char> local_260 [17];
  undefined8 local_40;
  undefined8 uStack_38;
  undefined2 local_30;
  char local_2c;
  char local_23;
  float_spec_handler local_22;
  align_spec *local_20;
  longdouble local_18;
  
  spec_00 = (align_spec *)CONCAT62(in_stack_fffffffffffffd3a,in_stack_fffffffffffffd38);
  local_18 = in_stack_00000008;
  local_20 = in_RSI;
  float_spec_handler::float_spec_handler(&local_22,*(char *)((long)&in_RSI[1].fill_ + 1));
  internal::handle_float_type_spec<fmt::v5::float_spec_handler&>
            (in_stack_fffffffffffffce7,in_stack_fffffffffffffcd8);
  local_23 = '\0';
  bVar1 = std::signbit(local_18);
  if (bVar1) {
    local_23 = '-';
    local_18 = -local_18;
  }
  else {
    bVar1 = core_format_specs::has((core_format_specs *)(local_20 + 1),1);
    if (bVar1) {
      bVar1 = core_format_specs::has((core_format_specs *)(local_20 + 1),2);
      local_2f1 = '+';
      if (!bVar1) {
        local_2f1 = ' ';
      }
      local_23 = local_2f1;
    }
  }
  local_30 = (undefined2)local_20[1].fill_;
  local_40._0_4_ = local_20->width_;
  local_40._4_4_ = local_20->fill_;
  uStack_38 = *(undefined8 *)&local_20->align_;
  local_2c = local_23;
  bVar1 = std::numeric_limits<fmt::v5::internal::dummy_int>::isnotanumber<long_double>
                    ((longdouble)CONCAT28(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0));
  if (bVar1) {
    write_double<long_double>::write_inf_or_nan_t::operator()
              (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  }
  else {
    alloc = SUB108(local_18,0);
    uVar4 = (undefined2)((unkuint10)local_18 >> 0x40);
    bVar1 = std::numeric_limits<fmt::v5::internal::dummy_int>::isinfinity<long_double>
                      ((longdouble)CONCAT28(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0));
    if (bVar1) {
      write_double<long_double>::write_inf_or_nan_t::operator()
                (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    }
    else {
      std::allocator<char>::allocator();
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffce7,CONCAT52(in_stack_fffffffffffffce2,uVar4)),alloc
                );
      std::allocator<char>::~allocator(&local_261);
      n_00 = SUB108(local_18,0);
      uVar4 = (undefined2)((unkuint10)local_18 >> 0x40);
      internal::sprintf_format<long_double>
                ((longdouble)CONCAT28((short)spec_00,in_stack_fffffffffffffd30),
                 (buffer *)CONCAT71(in_stack_fffffffffffffd29,in_stack_fffffffffffffd28),
                 in_stack_fffffffffffffd40);
      internal::basic_buffer<char>::size(local_260);
      aVar2 = align_spec::align(local_20);
      if (aVar2 == ALIGN_NUMERIC) {
        if (local_23 != '\0') {
          pwVar3 = reserve((basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                            *)CONCAT17(in_stack_fffffffffffffce7,
                                       CONCAT52(in_stack_fffffffffffffce2,uVar4)),n_00);
          in_stack_fffffffffffffd40 = (core_format_specs)&stack0xfffffffffffffd38;
          spec_00 = (align_spec *)(pwVar3 + 1);
          *pwVar3 = (int)local_23;
          local_23 = '\0';
        }
      }
      else {
        align_spec::align(local_20);
      }
      basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
      ::
      write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::double_writer>
                ((basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                  *)in_stack_fffffffffffffd40,spec_00,(double_writer *)local_260);
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffce7,CONCAT52(in_stack_fffffffffffffce2,uVar4)));
    }
  }
  return;
}

Assistant:

void basic_writer<Range>::write_double(T value, const format_specs &spec) {
  // Check type.
  float_spec_handler handler(static_cast<char>(spec.type));
  internal::handle_float_type_spec(handler.type, handler);

  char sign = 0;
  // Use signbit instead of value < 0 because the latter is always
  // false for NaN.
  if (std::signbit(value)) {
    sign = '-';
    value = -value;
  } else if (spec.has(SIGN_FLAG)) {
    sign = spec.has(PLUS_FLAG) ? '+' : ' ';
  }

  struct write_inf_or_nan_t {
    basic_writer &writer;
    format_specs spec;
    char sign;
    void operator()(const char *str) const {
      writer.write_padded(spec, inf_or_nan_writer{sign, str});
    }
  } write_inf_or_nan = {*this, spec, sign};

  // Format NaN and ininity ourselves because sprintf's output is not consistent
  // across platforms.
  if (internal::fputil::isnotanumber(value))
    return write_inf_or_nan(handler.upper ? "NAN" : "nan");
  if (internal::fputil::isinfinity(value))
    return write_inf_or_nan(handler.upper ? "INF" : "inf");

  memory_buffer buffer;
  bool use_grisu = FMT_USE_GRISU && sizeof(T) <= sizeof(double) &&
      spec.type != 'a' && spec.type != 'A' &&
      internal::grisu2_format(static_cast<double>(value), buffer, spec);
  if (!use_grisu) {
    format_specs normalized_spec(spec);
    normalized_spec.type = handler.type;
    internal::sprintf_format(value, buffer, normalized_spec);
  }
  size_t n = buffer.size();
  align_spec as = spec;
  if (spec.align() == ALIGN_NUMERIC) {
    if (sign) {
      auto &&it = reserve(1);
      *it++ = static_cast<char_type>(sign);
      sign = 0;
      if (as.width_)
        --as.width_;
    }
    as.align_ = ALIGN_RIGHT;
  } else {
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    if (sign)
      ++n;
  }
  write_padded(as, double_writer{n, sign, buffer});
}